

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialogPrivate::newColorTypedIn(QColorDialogPrivate *this,QRgb rgb)

{
  long in_FS_OFFSET;
  int v;
  int s;
  int h;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QDialogPrivate).nativeDialogInUse == false) {
    local_2c = -0x55555556;
    local_30 = -0x55555556;
    local_34 = -0x55555556;
    rgb2hsv(rgb,&local_2c,&local_30,&local_34);
    QtPrivate::QColorPicker::setCol(this->cp,local_2c,local_30);
    QtPrivate::QColorLuminancePicker::setCol(this->lp,local_2c,local_30,local_34);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::newColorTypedIn(QRgb rgb)
{
    if (!nativeDialogInUse) {
        int h, s, v;
        rgb2hsv(rgb, h, s, v);
        cp->setCol(h, s);
        lp->setCol(h, s, v);
    }
}